

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O2

AmsConnection * __thiscall AmsRouter::GetConnection(AmsRouter *this,AmsNetId *amsDest)

{
  iterator iVar1;
  AmsConnection *pAVar2;
  
  std::recursive_mutex::lock(&this->mutex);
  iVar1 = std::
          _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_AmsConnection_*>,_std::_Select1st<std::pair<const_AmsNetId,_AmsConnection_*>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
          ::find(&(this->mapping)._M_t,amsDest);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mapping)._M_t._M_impl.super__Rb_tree_header) {
    pAVar2 = (AmsConnection *)0x0;
  }
  else {
    pAVar2 = (AmsConnection *)iVar1._M_node[1]._M_parent;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return pAVar2;
}

Assistant:

AmsConnection* AmsRouter::GetConnection(const AmsNetId& amsDest)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    const auto it = mapping.find(amsDest);
    if (it != mapping.end()) {
        return it->second;
    }
    return nullptr;
}